

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataDictionaryTestCase.cpp
# Opt level: O0

void __thiscall
SuiteDataDictionaryTests::checkIsInMessageFixture::checkIsInMessageFixture
          (checkIsInMessageFixture *this)

{
  allocator<char> local_91;
  string local_90;
  allocator<char> local_69;
  string local_68;
  allocator<char> local_31;
  string local_30;
  checkIsInMessageFixture *local_10;
  checkIsInMessageFixture *this_local;
  
  local_10 = this;
  FIX::DataDictionary::DataDictionary(&this->object);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"FIX.4.0",&local_31);
  FIX::DataDictionary::setVersion(&this->object,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  FIX::DataDictionary::addField(&this->object,8);
  FIX::DataDictionary::addField(&this->object,9);
  FIX::DataDictionary::addField(&this->object,0x23);
  FIX::DataDictionary::addField(&this->object,10);
  FIX::DataDictionary::addField(&this->object,0x70);
  FIX::DataDictionary::addField(&this->object,0x37);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"1",&local_69);
  FIX::DataDictionary::addMsgType(&this->object,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator(&local_69);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"1",&local_91);
  FIX::DataDictionary::addMsgField(&this->object,&local_90,0x70);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator(&local_91);
  return;
}

Assistant:

checkIsInMessageFixture()
  {
    object.setVersion( BeginString_FIX40 );
    object.addField( FIELD::BeginString );
    object.addField( FIELD::BodyLength );
    object.addField( FIELD::MsgType );
    object.addField( FIELD::CheckSum );
    object.addField( FIELD::TestReqID );
    object.addField( FIELD::Symbol );
    object.addMsgType( MsgType_TestRequest );
    object.addMsgField( MsgType_TestRequest, FIELD::TestReqID );
  }